

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void cppforth::Forth::skipDecimalDigits
               (const_iterator beginIt,const_iterator endIt,const_iterator *it)

{
  bool bVar1;
  reference pcVar2;
  __unspec local_22;
  type local_21;
  char c;
  const_iterator *pcStack_20;
  const_iterator *it_local;
  const_iterator endIt_local;
  const_iterator beginIt_local;
  
  it->_M_current = (char *)beginIt;
  pcStack_20 = it;
  it_local = (const_iterator *)endIt._M_current;
  endIt_local._M_current = beginIt._M_current;
  while( true ) {
    local_21 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                               (pcStack_20,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&it_local);
    std::__cmp_cat::__unspec::__unspec(&local_22,(__unspec *)0x0);
    bVar1 = std::operator<(local_21);
    if (!bVar1) {
      return;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(pcStack_20);
    if (*pcVar2 < '0') break;
    if ('9' < *pcVar2) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(pcStack_20);
  }
  return;
}

Assistant:

static void skipDecimalDigits(const std::string::const_iterator beginIt, const std::string::const_iterator endIt, 
				std::string::const_iterator &it) {
			it = beginIt;
			while (it < endIt) {
				auto c = (*it);
				if (c>='0' && c<='9') {
					++it;
				}
				else {
					break;
				}
			}
			return ;
		}